

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# worker.c
# Opt level: O3

int worker_start(worker_handle *wh)

{
  void *pvVar1;
  int iVar2;
  
  pvVar1 = wh->priv;
  mutex_lock((mutex_handle *)((long)pvVar1 + 0x10));
  iVar2 = 0;
  if (*(int *)((long)pvVar1 + 0x38) == 0) {
    *(undefined4 *)((long)pvVar1 + 0x38) = 6;
    iVar2 = thread_start((thread_handle *)((long)pvVar1 + 0x18));
  }
  mutex_unlock((mutex_handle *)((long)pvVar1 + 0x10));
  return iVar2;
}

Assistant:

int worker_start(struct worker_handle *wh)
{
	struct worker_priv *priv = wh->priv;
	int ret = 0;

	mutex_lock(&priv->mutex);

	if (priv->state <= WORKER_STOPPED) {
		priv->state = WORKER_STARTING;
		ret = thread_start(&priv->thread);
	}

	mutex_unlock(&priv->mutex);

	return ret;
}